

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O1

void JPCommonLabel_push_word
               (JPCommonLabel *label,char *pron,char *pos,char *ctype,char *cform,int acc,
               int chain_flag)

{
  JPCommonLabelPhoneme *pJVar1;
  _JPCommonLabelWord *p_Var2;
  bool bVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  _JPCommonLabelPhoneme *p_Var7;
  _JPCommonLabelMora *p_Var8;
  char *pcVar9;
  _JPCommonLabelMora *p_Var10;
  JPCommonLabelWord *w;
  char *pcVar11;
  JPCommonLabelMora *head;
  JPCommonLabelWord *pJVar12;
  _JPCommonLabelAccentPhrase *p_Var13;
  _JPCommonLabelBreathGroup *p_Var14;
  _JPCommonLabelAccentPhrase *p_Var15;
  _JPCommonLabelBreathGroup *p_Var16;
  long lVar17;
  char cVar18;
  int iVar19;
  long lVar20;
  JPCommonLabelWord *in_stack_ffffffffffffff78;
  
  iVar6 = strcmp(pron,anon_var_dwarf_12ed96);
  if (iVar6 != 0) {
    iVar6 = strcmp(pron,anon_var_dwarf_9b0 + 0x12);
    if (iVar6 != 0) {
      if (*pron == '\0') {
        bVar3 = true;
      }
      else {
        bVar3 = true;
        do {
          lVar17 = 0;
          cVar5 = -0x1d;
          do {
            cVar18 = cVar5;
            pcVar9 = pron + lVar17;
            if (*pcVar9 != cVar18) {
              lVar17 = -1;
              goto LAB_001735fc;
            }
            lVar20 = lVar17 + 7;
            lVar17 = lVar17 + 1;
            cVar5 = anon_var_dwarf_135003[lVar20];
          } while (lVar17 != 3);
          lVar17 = 3;
LAB_001735fc:
          if (*pcVar9 == cVar18) {
            if ((label->phoneme_tail == (JPCommonLabelPhoneme *)0x0) ||
               (label->short_pause_flag != 0)) {
              JPCommonLabel_push_word_cold_2();
            }
            else {
              JPCommonLabel_insert_pause(label);
              p_Var7 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
              pJVar1 = label->phoneme_tail;
              pJVar1->next = p_Var7;
              p_Var8 = (_JPCommonLabelMora *)calloc(1,0x30);
              p_Var10 = label->mora_tail;
              p_Var10->next = p_Var8;
              pcVar9 = strdup(pJVar1->phoneme);
              p_Var7->phoneme = pcVar9;
              p_Var7->prev = pJVar1;
              p_Var7->next = (_JPCommonLabelPhoneme *)0x0;
              p_Var7->up = p_Var8;
              p_Var7 = pJVar1->next;
              p_Var2 = p_Var10->up;
              pcVar9 = strdup(anon_var_dwarf_135003 + 6);
              p_Var8->mora = pcVar9;
              p_Var8->head = p_Var7;
              p_Var8->tail = p_Var7;
              p_Var8->prev = p_Var10;
              p_Var8->next = (_JPCommonLabelMora *)0x0;
              p_Var8->up = p_Var2;
              label->phoneme_tail = p_Var7;
              p_Var10 = p_Var10->next;
              label->mora_tail = p_Var10;
              label->word_tail->tail = p_Var10;
            }
          }
          else {
            lVar17 = 0;
            cVar5 = -0x1e;
            do {
              cVar18 = cVar5;
              pcVar9 = pron + lVar17;
              if (*pcVar9 != cVar18) {
                lVar17 = -1;
                goto LAB_0017370b;
              }
              lVar20 = lVar17 + 1;
              lVar17 = lVar17 + 1;
              cVar5 = anon_var_dwarf_12e3ec[lVar20];
            } while (lVar17 != 3);
            lVar17 = 3;
LAB_0017370b:
            if (*pcVar9 == cVar18) {
              pJVar1 = label->phoneme_tail;
              if ((pJVar1 == (JPCommonLabelPhoneme *)0x0) || (bVar3)) {
                JPCommonLabel_push_word_cold_1();
              }
              else {
                pcVar9 = pJVar1->phoneme;
                lVar20 = 1;
                do {
                  iVar6 = strcmp(*(char **)(&UNK_001a4748 + lVar20 * 8),pcVar9);
                  if (iVar6 == 0) {
                    free(pcVar9);
                    pcVar9 = strdup(jpcommon_unvoice_list[lVar20]);
                    pJVar1->phoneme = pcVar9;
                    goto LAB_00173b3f;
                  }
                  lVar20 = lVar20 + 2;
                } while (lVar20 != 0xb);
                fprintf(_stderr,
                        "WARNING: JPCommonLabelPhoneme_convert_unvoice() in jpcommon_label.c: %s cannot be unvoiced.\n"
                        ,pcVar9);
              }
            }
            else {
              lVar17 = 0;
              pcVar9 = anon_var_dwarf_13204b;
              do {
                lVar20 = 0;
                cVar5 = *pcVar9;
                while (cVar5 != '\0') {
                  if (pron[lVar20] != cVar5) {
                    lVar20 = 0xffffffff;
                    break;
                  }
                  lVar4 = lVar20 + 1;
                  lVar20 = lVar20 + 1;
                  cVar5 = pcVar9[lVar4];
                }
                iVar6 = (int)lVar20;
                if (iVar6 != -1) goto LAB_001737b7;
                pcVar9 = jpcommon_mora_list[lVar17 + 3];
                lVar17 = lVar17 + 3;
              } while (pcVar9 != (char *)0x0);
              iVar6 = -1;
LAB_001737b7:
              if (iVar6 == -1) {
                fprintf(_stderr,
                        "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: %s is wrong mora list.\n"
                        ,pron);
                break;
              }
              iVar19 = (int)lVar17;
              if (label->phoneme_tail == (JPCommonLabelPhoneme *)0x0) {
                JPCommonLabel_insert_pause(label);
                p_Var7 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
                label->phoneme_tail = p_Var7;
                head = (JPCommonLabelMora *)calloc(1,0x30);
                label->mora_tail = head;
                pJVar12 = (JPCommonLabelWord *)calloc(1,0x48);
                label->word_tail = pJVar12;
                pcVar11 = strdup(jpcommon_mora_list[iVar19 + 1]);
                p_Var7->phoneme = pcVar11;
                p_Var7->prev = (_JPCommonLabelPhoneme *)0x0;
                p_Var7->next = (_JPCommonLabelPhoneme *)0x0;
                p_Var7->up = head;
                pcVar9 = strdup(pcVar9);
                head->mora = pcVar9;
                head->head = p_Var7;
                head->tail = p_Var7;
                head->prev = (_JPCommonLabelMora *)0x0;
                head->next = (_JPCommonLabelMora *)0x0;
                head->up = pJVar12;
                JPCommonLabelWord_initialize
                          (pJVar12,pron,pos,ctype,cform,head,head,(JPCommonLabelWord *)0x0,
                           in_stack_ffffffffffffff78);
                label->phoneme_head = label->phoneme_tail;
                label->mora_head = label->mora_tail;
                label->word_head = label->word_tail;
              }
              else {
                JPCommonLabel_insert_pause(label);
                p_Var7 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
                pJVar1 = label->phoneme_tail;
                pJVar1->next = p_Var7;
                p_Var10 = (_JPCommonLabelMora *)calloc(1,0x30);
                if (bVar3) {
                  p_Var8 = label->mora_tail;
                  p_Var8->next = p_Var10;
                  w = (JPCommonLabelWord *)calloc(1,0x48);
                  pJVar12 = label->word_tail;
                  pJVar12->next = w;
                  pcVar11 = strdup(jpcommon_mora_list[iVar19 + 1]);
                  p_Var7->phoneme = pcVar11;
                  p_Var7->prev = pJVar1;
                  p_Var7->next = (_JPCommonLabelPhoneme *)0x0;
                  p_Var7->up = p_Var10;
                  p_Var7 = pJVar1->next;
                  pcVar9 = strdup(pcVar9);
                  p_Var10->mora = pcVar9;
                  p_Var10->head = p_Var7;
                  p_Var10->tail = p_Var7;
                  p_Var10->prev = p_Var8;
                  p_Var10->next = (_JPCommonLabelMora *)0x0;
                  p_Var10->up = w;
                  JPCommonLabelWord_initialize
                            (w,pron,pos,ctype,cform,p_Var8->next,p_Var8->next,pJVar12,
                             in_stack_ffffffffffffff78);
                  label->phoneme_tail = label->phoneme_tail->next;
                  label->mora_tail = label->mora_tail->next;
                  label->word_tail = label->word_tail->next;
                }
                else {
                  p_Var8 = label->mora_tail;
                  p_Var8->next = p_Var10;
                  pcVar11 = strdup(jpcommon_mora_list[iVar19 + 1]);
                  p_Var7->phoneme = pcVar11;
                  p_Var7->prev = pJVar1;
                  p_Var7->next = (_JPCommonLabelPhoneme *)0x0;
                  p_Var7->up = p_Var10;
                  p_Var7 = pJVar1->next;
                  p_Var2 = p_Var8->up;
                  pcVar9 = strdup(pcVar9);
                  p_Var10->mora = pcVar9;
                  p_Var10->head = p_Var7;
                  p_Var10->tail = p_Var7;
                  p_Var10->prev = p_Var8;
                  p_Var10->next = (_JPCommonLabelMora *)0x0;
                  p_Var10->up = p_Var2;
                  label->phoneme_tail = p_Var7;
                  p_Var10 = p_Var8->next;
                  label->mora_tail = p_Var10;
                  label->word_tail->tail = p_Var10;
                }
              }
              pcVar9 = jpcommon_mora_list[iVar19 + 2];
              if (pcVar9 != (char *)0x0) {
                JPCommonLabel_insert_pause(label);
                p_Var7 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
                pJVar1 = label->phoneme_tail;
                pJVar1->next = p_Var7;
                p_Var10 = label->mora_tail;
                pcVar9 = strdup(pcVar9);
                p_Var7->phoneme = pcVar9;
                p_Var7->prev = pJVar1;
                p_Var7->next = (_JPCommonLabelPhoneme *)0x0;
                p_Var7->up = p_Var10;
                p_Var7 = pJVar1->next;
                label->phoneme_tail = p_Var7;
                p_Var10->tail = p_Var7;
              }
              lVar17 = (long)iVar6;
              bVar3 = false;
            }
          }
LAB_00173b3f:
          pcVar9 = pron + lVar17;
          pron = pron + lVar17;
        } while (*pcVar9 != '\0');
      }
      if (bVar3) {
        return;
      }
      if (label->phoneme_tail == (JPCommonLabelPhoneme *)0x0) {
        return;
      }
      iVar6 = strcmp(label->phoneme_tail->phoneme,"pau");
      if (iVar6 == 0) {
        return;
      }
      pJVar12 = label->word_tail;
      if (label->word_head != pJVar12) {
        if (chain_flag == 1) {
          p_Var13 = label->accent_tail;
          pJVar12->up = p_Var13;
          p_Var13->tail = pJVar12;
          return;
        }
        iVar6 = strcmp(pJVar12->prev->tail->tail->next->phoneme,"pau");
        p_Var15 = (_JPCommonLabelAccentPhrase *)calloc(1,0x38);
        p_Var13 = label->accent_tail;
        p_Var13->next = p_Var15;
        if (iVar6 != 0) {
          pJVar12->up = p_Var15;
          p_Var14 = label->breath_tail;
          p_Var15->accent = acc;
          p_Var15->emotion = (char *)0x0;
          p_Var15->head = pJVar12;
          p_Var15->tail = pJVar12;
          p_Var15->prev = p_Var13;
          p_Var15->next = (_JPCommonLabelAccentPhrase *)0x0;
          p_Var15->up = p_Var14;
          p_Var13 = p_Var13->next;
          p_Var14->tail = p_Var13;
          label->accent_tail = p_Var13;
          return;
        }
        p_Var16 = (_JPCommonLabelBreathGroup *)calloc(1,0x20);
        p_Var14 = label->breath_tail;
        p_Var14->next = p_Var16;
        pJVar12->up = p_Var15;
        p_Var15->accent = acc;
        p_Var15->emotion = (char *)0x0;
        p_Var15->head = pJVar12;
        p_Var15->tail = pJVar12;
        p_Var15->prev = p_Var13;
        p_Var15->next = (_JPCommonLabelAccentPhrase *)0x0;
        p_Var15->up = p_Var16;
        p_Var13 = p_Var13->next;
        p_Var16->head = p_Var13;
        p_Var16->tail = p_Var13;
        p_Var16->prev = p_Var14;
        p_Var16->next = (_JPCommonLabelBreathGroup *)0x0;
        label->accent_tail = p_Var13;
        label->breath_tail = p_Var14->next;
        return;
      }
      p_Var13 = (_JPCommonLabelAccentPhrase *)calloc(1,0x38);
      label->accent_tail = p_Var13;
      p_Var14 = (_JPCommonLabelBreathGroup *)calloc(1,0x20);
      label->breath_tail = p_Var14;
      pJVar12->up = p_Var13;
      p_Var13->accent = acc;
      p_Var13->emotion = (char *)0x0;
      p_Var13->head = pJVar12;
      p_Var13->tail = pJVar12;
      p_Var13->prev = (_JPCommonLabelAccentPhrase *)0x0;
      p_Var13->next = (_JPCommonLabelAccentPhrase *)0x0;
      p_Var13->up = p_Var14;
      p_Var14->head = p_Var13;
      p_Var14->tail = p_Var13;
      p_Var14->prev = (_JPCommonLabelBreathGroup *)0x0;
      p_Var14->next = (_JPCommonLabelBreathGroup *)0x0;
      label->accent_head = p_Var13;
      label->breath_head = p_Var14;
      return;
    }
    pJVar1 = label->phoneme_tail;
    if (pJVar1 == (JPCommonLabelPhoneme *)0x0) {
      JPCommonLabel_push_word_cold_3();
    }
    else {
      iVar6 = strcmp(pJVar1->phoneme,"pau");
      if (iVar6 == 0) {
        p_Var10 = pJVar1->prev->up;
      }
      else {
        p_Var10 = pJVar1->up;
      }
      p_Var13 = p_Var10->up->up;
      if (p_Var13->emotion == (char *)0x0) {
        pcVar9 = strdup("1");
        p_Var13->emotion = pcVar9;
      }
    }
  }
  label->short_pause_flag = 1;
  return;
}

Assistant:

void JPCommonLabel_push_word(JPCommonLabel * label, const char *pron, const char *pos,
                             const char *ctype, const char *cform, int acc, int chain_flag)
{
   int i;
   int find;
   int is_first_word = 1;

   if (strcmp(pron, JPCOMMON_MORA_SHORT_PAUSE) == 0) {
      label->short_pause_flag = 1;
      return;
   }

   /* set emotion flag */
   if (strcmp(pron, JPCOMMON_MORA_QUESTION) == 0) {
      if (label->phoneme_tail != NULL) {
         if (strcmp(label->phoneme_tail->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0) {
            if (label->phoneme_tail->prev->up->up->up->emotion == NULL)
               label->phoneme_tail->prev->up->up->up->emotion = strdup(JPCOMMON_FLAG_QUESTION);
         } else {
            if (label->phoneme_tail->up->up->up->emotion == NULL)
               label->phoneme_tail->up->up->up->emotion = strdup(JPCOMMON_FLAG_QUESTION);
         }
      } else {
         fprintf(stderr,
                 "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be question flag.\n");
      }
      label->short_pause_flag = 1;
      return;
   }

   /* analysis pron */
   while (pron[0] != '\0') {
      find = strtopcmp(pron, JPCOMMON_MORA_LONG_VOWEL);
      if (find != -1) {
         /* for long vowel */
         if (label->phoneme_tail != NULL && label->short_pause_flag == 0) {
            JPCommonLabel_insert_pause(label);
            label->phoneme_tail->next =
                (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
            label->mora_tail->next = (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
            JPCommonLabelPhoneme_initialize(label->phoneme_tail->next, label->phoneme_tail->phoneme,
                                            label->phoneme_tail, NULL, label->mora_tail->next);
            JPCommonLabelMora_initialize(label->mora_tail->next, JPCOMMON_MORA_LONG_VOWEL,
                                         label->phoneme_tail->next, label->phoneme_tail->next,
                                         label->mora_tail, NULL, label->mora_tail->up);
            label->phoneme_tail = label->phoneme_tail->next;
            label->mora_tail = label->mora_tail->next;
            label->word_tail->tail = label->mora_tail;
         } else {
            fprintf(stderr,
                    "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be long vowel symbol.\n");
         }
         pron += find;
      } else {
         find = strtopcmp(pron, JPCOMMON_MORA_UNVOICE);
         if (find != -1) {
            /* for unvoice */
            if (label->phoneme_tail != NULL && is_first_word != 1)
               JPCommonLabelPhoneme_convert_unvoice(label->phoneme_tail);
            else
               fprintf(stderr,
                       "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be unvoice flag.\n");
            pron += find;
         } else {
            /* for normal word */
            for (i = 0; jpcommon_mora_list[i] != NULL; i += 3) {
               find = strtopcmp(pron, jpcommon_mora_list[i]);
               if (find != -1)
                  break;
            }
            if (find != -1) {
               if (label->phoneme_tail == NULL) {
                  JPCommonLabel_insert_pause(label);
                  label->phoneme_tail =
                      (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                  label->mora_tail = (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                  label->word_tail = (JPCommonLabelWord *) calloc(1, sizeof(JPCommonLabelWord));
                  JPCommonLabelPhoneme_initialize(label->phoneme_tail, jpcommon_mora_list[i + 1],
                                                  NULL, NULL, label->mora_tail);
                  JPCommonLabelMora_initialize(label->mora_tail, jpcommon_mora_list[i],
                                               label->phoneme_tail, label->phoneme_tail, NULL, NULL,
                                               label->word_tail);
                  JPCommonLabelWord_initialize(label->word_tail, pron, pos, ctype, cform,
                                               label->mora_tail, label->mora_tail, NULL, NULL);
                  label->phoneme_head = label->phoneme_tail;
                  label->mora_head = label->mora_tail;
                  label->word_head = label->word_tail;
                  is_first_word = 0;
               } else {
                  if (is_first_word == 1) {
                     JPCommonLabel_insert_pause(label);
                     label->phoneme_tail->next =
                         (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                     label->mora_tail->next =
                         (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                     label->word_tail->next =
                         (JPCommonLabelWord *) calloc(1, sizeof(JPCommonLabelWord));
                     JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                     jpcommon_mora_list[i + 1], label->phoneme_tail,
                                                     NULL, label->mora_tail->next);
                     JPCommonLabelMora_initialize(label->mora_tail->next, jpcommon_mora_list[i],
                                                  label->phoneme_tail->next,
                                                  label->phoneme_tail->next, label->mora_tail, NULL,
                                                  label->word_tail->next);
                     JPCommonLabelWord_initialize(label->word_tail->next, pron, pos, ctype, cform,
                                                  label->mora_tail->next, label->mora_tail->next,
                                                  label->word_tail, NULL);
                     label->phoneme_tail = label->phoneme_tail->next;
                     label->mora_tail = label->mora_tail->next;
                     label->word_tail = label->word_tail->next;
                     is_first_word = 0;
                  } else {
                     JPCommonLabel_insert_pause(label);
                     label->phoneme_tail->next =
                         (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                     label->mora_tail->next =
                         (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                     JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                     jpcommon_mora_list[i + 1], label->phoneme_tail,
                                                     NULL, label->mora_tail->next);
                     JPCommonLabelMora_initialize(label->mora_tail->next, jpcommon_mora_list[i],
                                                  label->phoneme_tail->next,
                                                  label->phoneme_tail->next, label->mora_tail, NULL,
                                                  label->mora_tail->up);
                     label->phoneme_tail = label->phoneme_tail->next;
                     label->mora_tail = label->mora_tail->next;
                     label->word_tail->tail = label->mora_tail;
                  }
               }
               if (jpcommon_mora_list[i + 2] != NULL) {
                  JPCommonLabel_insert_pause(label);
                  label->phoneme_tail->next =
                      (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                  JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                  jpcommon_mora_list[i + 2], label->phoneme_tail,
                                                  NULL, label->mora_tail);
                  label->phoneme_tail = label->phoneme_tail->next;
                  label->mora_tail->tail = label->phoneme_tail;
               }
               pron += find;
            } else {
               fprintf(stderr,
                       "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: %s is wrong mora list.\n",
                       pron);
               break;
            }
         }
      }
   }

   /* check */
   if (is_first_word == 1)
      return;
   if (label->phoneme_tail == NULL)
      return;
   if (strcmp(label->phoneme_tail->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0)
      return;

   /* make accent, phrase */
   if (label->word_head == label->word_tail) {
      /* first word */
      label->accent_tail =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));

      label->breath_tail = (JPCommonLabelBreathGroup *) calloc(1, sizeof(JPCommonLabelBreathGroup));
      label->word_tail->up = label->accent_tail;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail, acc, NULL, label->word_tail,
                                           label->word_tail, NULL, NULL, label->breath_tail);
      JPCommonLabelBreathGroup_initialize(label->breath_tail, label->accent_tail,
                                          label->accent_tail, NULL, NULL);
      label->accent_head = label->accent_tail;
      label->breath_head = label->breath_tail;
   } else if (chain_flag == 1) {
      /* common accent phrase and common phrase */
      label->word_tail->up = label->accent_tail;
      label->accent_tail->tail = label->word_tail;
   } else
       if (strcmp(label->word_tail->prev->tail->tail->next->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE)
           != 0) {
      /* different accent phrase && common phrase */
      label->accent_tail->next =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));
      label->word_tail->up = label->accent_tail->next;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail->next, acc, NULL, label->word_tail,
                                           label->word_tail, label->accent_tail, NULL,
                                           label->breath_tail);
      label->breath_tail->tail = label->accent_tail->next;
      label->accent_tail = label->accent_tail->next;
   } else {
      /* different accent phrase && different phrase */
      label->accent_tail->next =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));
      label->breath_tail->next =
          (JPCommonLabelBreathGroup *) calloc(1, sizeof(JPCommonLabelBreathGroup));
      label->word_tail->up = label->accent_tail->next;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail->next, acc, NULL, label->word_tail,
                                           label->word_tail, label->accent_tail, NULL,
                                           label->breath_tail->next);
      JPCommonLabelBreathGroup_initialize(label->breath_tail->next, label->accent_tail->next,
                                          label->accent_tail->next, label->breath_tail, NULL);
      label->accent_tail = label->accent_tail->next;
      label->breath_tail = label->breath_tail->next;
   }
}